

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL>
slang::ast::Statement::createBlockItems
          (Scope *scope,StatementSyntax *syntax,bool labelHandled,
          SmallVector<const_slang::syntax::SyntaxNode_*,_5UL> *extraMembers)

{
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  Compilation *dst;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar1;
  SmallVector<const_slang::ast::StatementBlockSymbol_*,_5UL> buffer;
  SmallVectorBase<const_slang::ast::StatementBlockSymbol_*> local_50 [2];
  
  local_50[0].data_ = (pointer)local_50[0].firstElement;
  local_50[0].len = 0;
  local_50[0].cap = 5;
  findBlocks(scope,syntax,local_50,extraMembers,labelHandled);
  dst = scope->compilation;
  sVar1._M_ptr._0_4_ =
       SmallVectorBase<const_slang::ast::StatementBlockSymbol_*>::copy
                 (local_50,(EVP_PKEY_CTX *)dst,src);
  sVar1._M_ptr._4_4_ = extraout_var;
  SmallVectorBase<const_slang::ast::StatementBlockSymbol_*>::cleanup(local_50,(EVP_PKEY_CTX *)dst);
  sVar1._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  return sVar1;
}

Assistant:

std::span<const StatementBlockSymbol* const> Statement::createBlockItems(
    const Scope& scope, const StatementSyntax& syntax, bool labelHandled,
    SmallVector<const SyntaxNode*>& extraMembers) {

    SmallVector<const StatementBlockSymbol*> buffer;
    findBlocks(scope, syntax, buffer, extraMembers, labelHandled);
    return buffer.copy(scope.getCompilation());
}